

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse_Args.cpp
# Opt level: O1

int __thiscall Nova::Parse_Args::Find_Match(Parse_Args *this,string *str)

{
  pointer pAVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  long lVar5;
  size_type *psVar6;
  
  pAVar1 = (this->arg_data_list).super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->arg_data_list).
                super__Vector_base<Nova::Arg_Data,_std::allocator<Nova::Arg_Data>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pAVar1;
  if (lVar4 != 0) {
    lVar5 = (lVar4 >> 3) * 0x6f96f96f96f96f97;
    __s2 = (str->_M_dataplus)._M_p;
    sVar2 = str->_M_string_length;
    psVar6 = &(pAVar1->str)._M_string_length;
    lVar4 = 0;
    do {
      __n = *psVar6;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)lVar4;
      }
      lVar4 = lVar4 + 1;
      psVar6 = psVar6 + 0x27;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  return -1;
}

Assistant:

int Parse_Args::
Find_Match(const std::string& str) const
{
    for(int i=0;i<arg_data_list.size();i++) if(arg_data_list[i].str==str) return i;
    return -1;
}